

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

natwm_error monitor_setup(natwm_state *state,monitor_list **result)

{
  server_extension_type sVar1;
  xcb_randr_crtc_t xVar2;
  uint uVar3;
  randr_monitor *monitor;
  xcb_rectangle_t xVar4;
  size_t sVar5;
  void *pvVar6;
  natwm_error nVar7;
  server_extension *__ptr;
  list *list;
  xcb_randr_crtc_t *data;
  undefined4 *puVar8;
  monitor_list *list_00;
  char *pcVar9;
  long lVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar11;
  randr_monitor **pprVar12;
  randr_monitor **pprVar13;
  node *pnVar14;
  undefined8 uVar15;
  config_array *local_48;
  randr_monitor **monitors;
  list *local_38;
  
  uVar15 = 0x108463;
  __ptr = server_extension_detect(state->xcb);
  if (__ptr == (server_extension *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  sVar1 = __ptr->type;
  uVar11 = (ulong)sVar1;
  list = list_create();
  if (uVar11 == 1) {
    if (list == (list *)0x0) {
      pcVar9 = "Xinerama";
LAB_0010873c:
      nVar7 = MEMORY_ALLOCATION_ERROR;
      goto LAB_001087a0;
    }
    local_48 = (config_array *)0x0;
    monitors = (randr_monitor **)0x0;
    local_38 = list;
    nVar7 = xinerama_get_screens(state,(xcb_rectangle_t **)&local_48,(size_t *)&monitors);
    if (nVar7 == NO_ERROR) {
      if (monitors != (randr_monitor **)0x0) {
        pprVar13 = (randr_monitor **)0x0;
LAB_00108596:
        sVar5 = (&local_48->length)[(long)pprVar13];
        puVar8 = (undefined4 *)malloc(0x20);
        if (puVar8 != (undefined4 *)0x0) goto code_r0x001085b1;
        for (pnVar14 = local_38->head; pnVar14 != (node *)0x0; pnVar14 = pnVar14->next) {
          free(pnVar14->data);
        }
        list_destroy(local_38);
        free(local_48);
        nVar7 = MEMORY_ALLOCATION_ERROR;
        list = (list *)0x0;
        goto LAB_0010865a;
      }
LAB_001085d5:
      free(local_48);
      goto LAB_001085e7;
    }
LAB_0010864c:
    list_destroy(local_38);
    list = (list *)0x0;
LAB_0010865a:
    if (nVar7 == NO_ERROR) {
LAB_00108664:
      if (list->size == 0) {
        if (sVar1 < (NO_EXTENSION|XINERAMA)) {
          pcVar9 = (&PTR_anon_var_dwarf_e1bb_00111cb0)[uVar11];
        }
        else {
          pcVar9 = "";
        }
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find a %s screen",pcVar9);
        free(__ptr);
        return INVALID_INPUT_ERROR;
      }
      list_00 = (monitor_list *)malloc(0x10);
      if (list_00 == (monitor_list *)0x0) {
        free(__ptr);
        list_destroy(list);
        return MEMORY_ALLOCATION_ERROR;
      }
      list_00->extension = __ptr;
      list_00->monitors = list;
      local_48 = (config_array *)0x0;
      config_find_array(state->config,"monitor.offsets",&local_48);
      if ((local_48 != (config_array *)0x0) && (local_48->length != 0)) {
        if (local_48->length < list->size) {
          pcVar9 = 
          "Encountered more monitors than items in \'monitor.offsets\' array. Ignoring offsets";
LAB_001086e3:
          internal_logger(natwm_logger,LEVEL_WARNING,pcVar9);
        }
        else {
          pnVar14 = list->head;
          if (pnVar14 != (node *)0x0) {
            lVar10 = 0;
            do {
              pvVar6 = pnVar14->data;
              monitors = (randr_monitor **)0x0;
              if (local_48->values[lVar10]->type == ARRAY) {
                nVar7 = config_array_to_box_sizes
                                  ((local_48->values[lVar10]->data).array,(box_sizes *)&monitors);
                if (nVar7 != NO_ERROR) {
                  pcVar9 = "Skipping invalid monitor offset value";
                  goto LAB_001086e3;
                }
                *(randr_monitor ***)((long)pvVar6 + 0xc) = monitors;
                lVar10 = lVar10 + 1;
              }
              else {
                internal_logger(natwm_logger,LEVEL_WARNING,"Skipping invalid monitor offset value");
              }
              pnVar14 = pnVar14->next;
            } while (pnVar14 != (node *)0x0);
          }
        }
      }
      ewmh_update_desktop_viewport(state,list_00);
      *result = list_00;
      return NO_ERROR;
    }
  }
  else {
    if (sVar1 == RANDR) {
      if (list == (list *)0x0) {
        pcVar9 = "RANDR";
        goto LAB_0010873c;
      }
      local_48 = (config_array *)0x0;
      monitors = (randr_monitor **)0x0;
      local_38 = list;
      nVar7 = randr_get_screens(state,(randr_monitor ***)&local_48,(size_t *)&monitors);
      if (nVar7 != NO_ERROR) goto LAB_0010864c;
      if (monitors != (randr_monitor **)0x0) {
        pprVar12 = (randr_monitor **)0x0;
        pprVar13 = monitors;
LAB_001084de:
        monitor = (randr_monitor *)(&local_48->length)[(long)pprVar12];
        if (monitor == (randr_monitor *)0x0) goto LAB_00108537;
        xVar2 = monitor->id;
        xVar4 = monitor->rect;
        data = (xcb_randr_crtc_t *)malloc(0x20);
        if (data != (xcb_randr_crtc_t *)0x0) {
          *data = xVar2;
          *(xcb_rectangle_t *)(data + 1) = xVar4;
          data[6] = 0;
          data[7] = 0;
          list_insert(local_38,data);
          randr_monitor_destroy(monitor);
          pprVar13 = monitors;
          goto LAB_00108537;
        }
        for (pnVar14 = local_38->head; pnVar14 != (node *)0x0; pnVar14 = pnVar14->next) {
          free(pnVar14->data);
        }
        list_destroy(local_38);
        nVar7 = MEMORY_ALLOCATION_ERROR;
        list = (list *)0x0;
        goto LAB_0010865a;
      }
LAB_0010853f:
      free(local_48);
LAB_001085e7:
      nVar7 = NO_ERROR;
      list = local_38;
      goto LAB_0010865a;
    }
    nVar7 = MEMORY_ALLOCATION_ERROR;
    if (list != (list *)0x0) {
      uVar3._0_2_ = state->screen->width_in_pixels;
      uVar3._2_2_ = state->screen->height_in_pixels;
      puVar8 = (undefined4 *)malloc(0x20);
      if (puVar8 != (undefined4 *)0x0) {
        *puVar8 = 0;
        *(ulong *)(puVar8 + 1) = (ulong)uVar3 << 0x20;
        *(undefined8 *)(puVar8 + 6) = 0;
        list_insert(list,puVar8);
        goto LAB_00108664;
      }
      list_destroy(list);
    }
  }
  if (uVar11 == 0) {
    pcVar9 = "RANDR";
  }
  else if (sVar1 == NO_EXTENSION) {
    pcVar9 = "X";
  }
  else if (sVar1 == XINERAMA) {
    pcVar9 = "Xinerama";
  }
  else {
    pcVar9 = "";
  }
LAB_001087a0:
  internal_logger(natwm_logger,LEVEL_ERROR,"Failed to setup %s screen(s)",pcVar9,in_R8,in_R9,uVar15)
  ;
  free(__ptr);
  return nVar7;
code_r0x001085b1:
  *puVar8 = (int)pprVar13;
  *(size_t *)(puVar8 + 1) = sVar5;
  *(undefined8 *)(puVar8 + 6) = 0;
  list_insert(local_38,puVar8);
  pprVar13 = (randr_monitor **)((long)pprVar13 + 1);
  if (monitors <= pprVar13) goto LAB_001085d5;
  goto LAB_00108596;
LAB_00108537:
  pprVar12 = (randr_monitor **)((long)pprVar12 + 1);
  if (pprVar13 <= pprVar12) goto LAB_0010853f;
  goto LAB_001084de;
}

Assistant:

enum natwm_error monitor_setup(const struct natwm_state *state, struct monitor_list **result)
{
        struct server_extension *extension = server_extension_detect(state->xcb);

        if (extension == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        // Resolve monitors from any extension into a linked list of generic
        // monitors.
        enum natwm_error err = GENERIC_ERROR;
        struct list *monitors = NULL;

        if (extension->type == RANDR) {
                err = monitors_from_randr(state, &monitors);
        } else if (extension->type == XINERAMA) {
                err = monitors_from_xinerama(state, &monitors);
        } else {
                err = monitor_from_x(state, &monitors);
        }

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to setup %s screen(s)",
                          server_extension_to_string(extension->type));

                free(extension);

                return err;
        }

        if (monitors->size == 0) {
                LOG_ERROR(natwm_logger,
                          "Failed to find a %s screen",
                          server_extension_to_string(extension->type));

                free(extension);

                return INVALID_INPUT_ERROR;
        }

        struct monitor_list *monitor_list = monitor_list_create(extension, monitors);

        if (monitor_list == NULL) {
                free(extension);
                list_destroy(monitors);

                return MEMORY_ALLOCATION_ERROR;
        }

        monitor_list_set_offsets(state, monitor_list);

        // Initialize the desktop viewport
        ewmh_update_desktop_viewport(state, monitor_list);

        *result = monitor_list;

        return NO_ERROR;
}